

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvation_energy_compute.cpp
# Opt level: O3

void __thiscall
SolvationEnergyCompute::particle_particle_interact
          (SolvationEnergyCompute *this,array<unsigned_long,_2UL> target_node_idxs,
          array<unsigned_long,_2UL> source_node_idxs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Elements *pEVar5;
  Molecule *pMVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer pdVar13;
  pointer pdVar14;
  pointer pdVar15;
  pointer pdVar16;
  pointer pdVar17;
  pointer pdVar18;
  double *pdVar19;
  size_t target_node_end;
  ulong uVar20;
  size_t target_node_begin;
  ulong uVar21;
  double *pdVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  
  uVar21 = target_node_idxs._M_elems[0];
  if (uVar21 < target_node_idxs._M_elems[1]) {
    pEVar5 = this->elements_;
    pMVar6 = this->molecule_;
    pdVar7 = (pEVar5->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar8 = (pEVar5->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar9 = (pEVar5->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar10 = (pEVar5->nx_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (pEVar5->ny_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar12 = (pEVar5->nz_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13 = (pEVar5->area_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar14 = (this->potential_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar15 = (pMVar6->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar16 = (pMVar6->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar17 = (pMVar6->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar18 = (pMVar6->charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar19 = (this->solv_eng_vec_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      dVar23 = 0.0;
      dVar32 = 0.0;
      dVar26 = 0.0;
      dVar33 = 0.0;
      if (source_node_idxs._M_elems[0] < source_node_idxs._M_elems[1]) {
        dVar1 = pdVar7[uVar21];
        dVar2 = pdVar8[uVar21];
        dVar3 = pdVar9[uVar21];
        dVar24 = this->kappa_;
        dVar33 = 0.0;
        dVar26 = 0.0;
        dVar32 = 0.0;
        dVar23 = 0.0;
        uVar20 = source_node_idxs._M_elems[0];
        do {
          dVar28 = dVar1 - pdVar15[uVar20];
          dVar29 = dVar2 - pdVar16[uVar20];
          dVar30 = dVar3 - pdVar17[uVar20];
          dVar27 = SQRT(dVar30 * dVar30 + dVar28 * dVar28 + dVar29 * dVar29);
          dVar31 = 1.0 / dVar27;
          dVar25 = exp(-dVar24 * dVar27);
          dVar24 = this->kappa_;
          dVar4 = pdVar18[uVar20];
          dVar27 = dVar31 * dVar31 * 0.079577471545948 * dVar31 *
                   (1.0 - dVar25 * this->eps_ * (dVar27 * dVar24 + 1.0)) * dVar4;
          dVar33 = dVar33 + dVar4 * dVar31 * 0.079577471545948 * (1.0 - dVar25);
          dVar26 = dVar26 + dVar28 * dVar27;
          dVar32 = dVar32 + dVar27 * dVar29;
          dVar23 = dVar23 + dVar27 * dVar30;
          uVar20 = uVar20 + 1;
        } while (source_node_idxs._M_elems[1] != uVar20);
      }
      pdVar22 = pdVar14 + uVar21;
      dVar1 = pdVar13[uVar21];
      *pdVar19 = (dVar23 * pdVar12[uVar21] + dVar26 * pdVar10[uVar21] + dVar32 * pdVar11[uVar21]) *
                 dVar1 * *pdVar22 + pdVar22[this->potential_offset_] * dVar1 * dVar33 + *pdVar19;
      uVar21 = uVar21 + 1;
    } while (uVar21 != target_node_idxs._M_elems[1]);
  }
  return;
}

Assistant:

void SolvationEnergyCompute::particle_particle_interact(std::array<std::size_t, 2> target_node_idxs,
                                                        std::array<std::size_t, 2> source_node_idxs)
{
//    timers_.particle_particle_interact.start();

    /* Targets */
    
    std::size_t target_node_begin          = target_node_idxs[0];
    std::size_t target_node_end            = target_node_idxs[1];

    const double* __restrict elem_x_ptr    = elements_.x_ptr();
    const double* __restrict elem_y_ptr    = elements_.y_ptr();
    const double* __restrict elem_z_ptr    = elements_.z_ptr();
    
    const double* __restrict elem_q_dx_ptr = elements_.nx_ptr();
    const double* __restrict elem_q_dy_ptr = elements_.ny_ptr();
    const double* __restrict elem_q_dz_ptr = elements_.nz_ptr();
    
    const double* __restrict elem_area_ptr = elements_.area_ptr();
    const double* __restrict potential_ptr = potential_.data();

    /* Sources */
    
    std::size_t source_node_begin      = source_node_idxs[0];
    std::size_t source_node_end        = source_node_idxs[1];
    
    const double* __restrict mol_x_ptr = molecule_.x_ptr();
    const double* __restrict mol_y_ptr = molecule_.y_ptr();
    const double* __restrict mol_z_ptr = molecule_.z_ptr();

    const double* __restrict mol_q_ptr = molecule_.charge_ptr();

    /* Potential */

    double* __restrict solv_eng_ptr = solv_eng_vec_.data();


#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc parallel loop async(stream_id) present(elem_x_ptr, elem_y_ptr, elem_z_ptr, elem_area_ptr, \
                                                       elem_q_dx_ptr, elem_q_dy_ptr, elem_q_dz_ptr, \
                                                       mol_x_ptr, mol_y_ptr, mol_z_ptr, mol_q_ptr, \
                                                       solv_eng_ptr, potential_ptr)
#endif
    for (std::size_t j = target_node_begin; j < target_node_end; ++j) {
        
        double target_x = elem_x_ptr[j];
        double target_y = elem_y_ptr[j];
        double target_z = elem_z_ptr[j];
        
        double pot_temp_dd = 0.;
        double pot_temp_dx = 0.;
        double pot_temp_dy = 0.;
        double pot_temp_dz = 0.;
        
#ifdef OPENACC_ENABLED
        #pragma acc loop reduction(+:pot_temp_dd, pot_temp_dx, \
                                     pot_temp_dy, pot_temp_dz)
#endif
        for (std::size_t k = source_node_begin; k < source_node_end; ++k) {

            double dx = target_x - mol_x_ptr[k];
            double dy = target_y - mol_y_ptr[k];
            double dz = target_z - mol_z_ptr[k];

            double r     = std::sqrt(dx*dx + dy*dy + dz*dz);
            double rinv  = 1. / r;
            double G0    = constants::ONE_OVER_4PI * rinv;
            double expkr = std::exp(-kappa_ * r);
            
            double L2  =  G0 * (1. - expkr);
            double L1  =  G0 * rinv * rinv * (1. - eps_ * expkr * (1. + kappa_ * r));

            pot_temp_dd += L2 * mol_q_ptr[k];
            pot_temp_dx += L1 * mol_q_ptr[k] * dx;
            pot_temp_dy += L1 * mol_q_ptr[k] * dy;
            pot_temp_dz += L1 * mol_q_ptr[k] * dz;
        }
        
        double pot_temp_1 = potential_ptr[j + potential_offset_]
                          * elem_area_ptr[j] * pot_temp_dd;
        double pot_temp_2 = potential_ptr[j] * elem_area_ptr[j]
                         * (elem_q_dx_ptr[j] * pot_temp_dx
                          + elem_q_dy_ptr[j] * pot_temp_dy
                          + elem_q_dz_ptr[j] * pot_temp_dz);

#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif  OPENMP_ENABLED
        #pragma omp atomic update
#endif
        solv_eng_ptr[0] += pot_temp_1 + pot_temp_2;
    }

//    timers_.particle_particle_interact.stop();
}